

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::IntlEngineInterfaceExtensionObject::EntryIntl_ValidateAndCanonicalizeTimeZone
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  JavascriptString *pJVar6;
  LPCSTR pCVar7;
  char16_t *string1;
  undefined4 extraout_var;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  uint in_stack_00000010;
  Var in_stack_00000020;
  char16_t local_118 [4];
  UChar match [100];
  ScopedICUObject<UEnumeration_*,_&uenum_close_70> local_40;
  ScopedUEnumeration available;
  int curLen;
  UErrorCode status;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar9 = callInfo._0_4_;
  if (in_stack_00000010 != uVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb32,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a2de1c;
    *puVar5 = 0;
  }
  if ((uVar9 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb32,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00a2de1c;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((uVar9 & 0xffffff) == 2) {
    bVar3 = VarIs<Js::JavascriptString>(in_stack_00000020);
    if (!bVar3) goto LAB_00a2da9d;
  }
  else {
    if (((ulong)callInfo & 0xffffff) == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb32,"(argCount > 0)","Should always have implicit \'this\'");
      if (!bVar3) goto LAB_00a2de1c;
      *puVar5 = 0;
    }
LAB_00a2da9d:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb33,
                                "((args.Info.Count == 2 && VarIs<JavascriptString>(args.Values[1])))"
                                ,"Intl platform function given bad arguments");
    if (!bVar3) goto LAB_00a2de1c;
    *puVar5 = 0;
  }
  pJVar6 = VarTo<Js::JavascriptString>(in_stack_00000020);
  available.object._4_4_ = 0;
  local_40.object =
       (UEnumeration *)
       ucal_openTimeZoneIDEnumeration_70(0,0,0,(undefined1 *)((long)&available.object + 4));
  iVar4 = uenum_count_70(local_40.object);
  if (available.object._4_4_ == 7) {
    Throw::OutOfMemory();
  }
  if (available.object._4_4_ < 1 && available.object._4_4_ != -0x7c) {
    if (iVar4 < 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb4b,"(availableLength > 0)","availableLength > 0");
      goto LAB_00a2dbea;
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    pCVar7 = (LPCSTR)u_errorName_70(available.object._4_4_);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb4b,"(false)",pCVar7);
LAB_00a2dbea:
    if (bVar3 == false) goto LAB_00a2de1c;
    *puVar5 = 0;
  }
  memset(local_118,0,200);
  iVar10 = 0;
  if (0 < iVar4) {
    iVar10 = iVar4;
  }
  do {
    bVar3 = iVar10 == 0;
    iVar10 = iVar10 + -1;
    if (bVar3) goto LAB_00a2ddea;
    available.object._0_4_ = -1;
    string1 = (char16_t *)
              uenum_unext_70(local_40.object,&available,(undefined1 *)((long)&available.object + 4))
    ;
    if (available.object._4_4_ == 7) goto LAB_00a2de17;
    if (0 < available.object._4_4_ || available.object._4_4_ == -0x7c) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      pCVar7 = (LPCSTR)u_errorName_70(available.object._4_4_);
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb53,"(false)",pCVar7);
      if (!bVar3) goto LAB_00a2de1c;
      *puVar5 = 0;
    }
    if ((int)available.object == 0) goto LAB_00a2de17;
    if ((int)available.object < 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0xb5c,"(curLen > 0)","curLen > 0");
      if (!bVar3) goto LAB_00a2de1c;
      *puVar5 = 0;
    }
    iVar4 = (*(pJVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x65])(pJVar6);
    iVar4 = _wcsicmp(string1,(char16_t *)CONCAT44(extraout_var,iVar4));
  } while (iVar4 != 0);
  ucal_getCanonicalTimeZoneID_70
            (string1,(int)available.object,local_118,100,0,
             (undefined1 *)((long)&available.object + 4));
  if (available.object._4_4_ == 7) {
LAB_00a2de17:
    Throw::OutOfMemory();
  }
  if (0 < available.object._4_4_ || available.object._4_4_ == -0x7c) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    pCVar7 = (LPCSTR)u_errorName_70(available.object._4_4_);
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb60,"(false)",pCVar7);
    if (!bVar3) goto LAB_00a2de1c;
    *puVar5 = 0;
  }
  sVar8 = PAL_wcslen(local_118);
  if (0x7ffffffd < sVar8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                ,0xb62,"(len < MaxCharCount)",
                                "Returned canonicalized timezone is far too long");
    if (!bVar3) {
LAB_00a2de1c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if ((charcount_t)sVar8 == 0) {
LAB_00a2ddea:
    pJVar6 = (JavascriptString *)
             (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pJVar6 = JavascriptString::NewCopyBuffer(local_118,(charcount_t)sVar8,pSVar1);
  }
  PlatformAgnostic::ICUHelpers::ScopedICUObject<UEnumeration_*,_&uenum_close_70>::~ScopedICUObject
            (&local_40);
  return pJVar6;
}

Assistant:

Var IntlEngineInterfaceExtensionObject::EntryIntl_ValidateAndCanonicalizeTimeZone(RecyclableObject* function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        INTL_CHECK_ARGS(args.Info.Count == 2 && VarIs<JavascriptString>(args.Values[1]));

        JavascriptString *tz = VarTo<JavascriptString>(args.Values[1]);

#ifdef INTL_WINGLOB
        AutoHSTRING canonicalizedTimeZone;
        boolean isValidTimeZone = GetWindowsGlobalizationAdapter(scriptContext)->ValidateAndCanonicalizeTimeZone(scriptContext, tz->GetSz(), &canonicalizedTimeZone);
        if (isValidTimeZone)
        {
            DelayLoadWindowsGlobalization* wsl = scriptContext->GetThreadContext()->GetWindowsGlobalizationLibrary();
            PCWSTR strBuf = wsl->WindowsGetStringRawBuffer(*canonicalizedTimeZone, NULL);
            return Js::JavascriptString::NewCopySz(strBuf, scriptContext);
        }
        else
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
#else
        UErrorCode status = U_ZERO_ERROR;

        // TODO(jahorto): Is this the list of timeZones that we want? How is this different from
        // the other two enum values or ucal_openTimeZones?
        ScopedUEnumeration available(ucal_openTimeZoneIDEnumeration(UCAL_ZONE_TYPE_ANY, nullptr, nullptr, &status));
        int availableLength = uenum_count(available, &status);
        ICU_ASSERT(status, availableLength > 0);

        charcount_t matchLen = 0;
        UChar match[100] = { 0 };
        for (int a = 0; a < availableLength; ++a)
        {
            int curLen = -1;
            const UChar *cur = uenum_unext(available, &curLen, &status);
            ICU_ASSERT(status, true);
            if (curLen == 0)
            {
                // OS#17175014: in rare cases, ICU will return U_ZERO_ERROR and a valid `cur` string but a length of 0
                // This only happens in an OOM during uenum_(u)next
                // Tracked by ICU: http://bugs.icu-project.org/trac/ticket/13739
                Throw::OutOfMemory();
            }

            AssertOrFailFast(curLen > 0);
            if (_wcsicmp(reinterpret_cast<const char16 *>(cur), tz->GetSz()) == 0)
            {
                ucal_getCanonicalTimeZoneID(cur, curLen, match, _countof(match), nullptr, &status);
                ICU_ASSERT(status, true);
                size_t len = wcslen(reinterpret_cast<const char16 *>(match));
                AssertMsg(len < MaxCharCount, "Returned canonicalized timezone is far too long");
                matchLen = static_cast<charcount_t>(len);
                break;
            }
        }

        if (matchLen == 0)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        return JavascriptString::NewCopyBuffer(reinterpret_cast<const char16 *>(match), matchLen, scriptContext);
#endif
    }